

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O3

CRef __thiscall
Gluco::ClauseAllocator::alloc<Gluco::Clause>(ClauseAllocator *this,Clause *ps,bool learnt)

{
  bool use_extra;
  Ref RVar1;
  
  use_extra = (bool)((this->super_RegionAllocator<unsigned_int>).field_0x14 | learnt);
  RVar1 = RegionAllocator<unsigned_int>::alloc
                    (&this->super_RegionAllocator<unsigned_int>,
                     (uint)use_extra + *(int *)&(ps->header).field_0x4 + 3);
  if (RVar1 < (this->super_RegionAllocator<unsigned_int>).sz) {
    Clause::Clause<Gluco::Clause>
              ((Clause *)((this->super_RegionAllocator<unsigned_int>).memory + RVar1),ps,use_extra,
               learnt);
    return RVar1;
  }
  __assert_fail("r >= 0 && r < sz",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Alloc.h"
                ,0x45,"T *Gluco::RegionAllocator<unsigned int>::lea(Ref) [T = unsigned int]");
}

Assistant:

CRef alloc(const Lits& ps, bool learnt = false)
    {
        assert(sizeof(Lit)      == sizeof(uint32_t));
        assert(sizeof(float)    == sizeof(uint32_t));
        bool use_extra = learnt | extra_clause_field;

        CRef cid = RegionAllocator<uint32_t>::alloc(clauseWord32Size(ps.size(), use_extra));
        new (lea(cid)) Clause(ps, use_extra, learnt);

        return cid;
    }